

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_242960::TfFinder::~TfFinder(TfFinder *this)

{
  ~TfFinder(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

~TfFinder() override = default;